

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O0

void rapidjson::internal::DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  int iVar1;
  char cVar2;
  DiyFp DVar3;
  uint local_d4;
  int index;
  char d_1;
  uint64_t tmp;
  uint32_t d;
  int kappa;
  uint64_t p2;
  uint32_t p1;
  DiyFp wp_w;
  DiyFp one;
  int *K_local;
  int *len_local;
  char *buffer_local;
  uint64_t delta_local;
  DiyFp *Mp_local;
  DiyFp *W_local;
  
  DiyFp::DiyFp((DiyFp *)&wp_w.e,1L << (-(char)Mp->e & 0x3fU),Mp->e);
  DVar3 = DiyFp::operator-(Mp,W);
  wp_w.f._0_4_ = DVar3.e;
  p2._4_4_ = (uint32_t)(Mp->f >> (-(char)one.f & 0x3fU));
  _d = (char *)(Mp->f & wp_w._8_8_ - 1);
  tmp._4_4_ = CountDecimalDigit32(p2._4_4_);
  *len = 0;
  do {
    buffer_local = (char *)delta;
    if (tmp._4_4_ < 1) {
      do {
        buffer_local = (char *)((long)buffer_local * 10);
        cVar2 = (char)((ulong)((long)_d * 10) >> (-(char)one.f & 0x3fU));
        if ((cVar2 != '\0') || (*len != 0)) {
          iVar1 = *len;
          *len = iVar1 + 1;
          buffer[iVar1] = cVar2 + '0';
        }
        _d = (char *)(wp_w._8_8_ - 1 & (long)_d * 10);
        tmp._4_4_ = tmp._4_4_ + -1;
      } while (buffer_local <= _d);
      *K = tmp._4_4_ + *K;
      if (-tmp._4_4_ < 9) {
        local_d4 = DigitGen::kPow10[-tmp._4_4_];
      }
      else {
        local_d4 = 0;
      }
      GrisuRound(buffer,*len,(uint64_t)buffer_local,(uint64_t)_d,wp_w._8_8_,
                 DVar3.f * (ulong)local_d4);
      return;
    }
    tmp._0_4_ = 0;
    switch(tmp._4_4_) {
    case 1:
      tmp._0_4_ = p2._4_4_;
      p2._4_4_ = 0;
      break;
    case 2:
      tmp._0_4_ = p2._4_4_ / 10;
      p2._4_4_ = p2._4_4_ % 10;
      break;
    case 3:
      tmp._0_4_ = p2._4_4_ / 100;
      p2._4_4_ = p2._4_4_ % 100;
      break;
    case 4:
      tmp._0_4_ = p2._4_4_ / 1000;
      p2._4_4_ = p2._4_4_ % 1000;
      break;
    case 5:
      tmp._0_4_ = p2._4_4_ / 10000;
      p2._4_4_ = p2._4_4_ % 10000;
      break;
    case 6:
      tmp._0_4_ = p2._4_4_ / 100000;
      p2._4_4_ = p2._4_4_ % 100000;
      break;
    case 7:
      tmp._0_4_ = p2._4_4_ / 1000000;
      p2._4_4_ = p2._4_4_ % 1000000;
      break;
    case 8:
      tmp._0_4_ = p2._4_4_ / 10000000;
      p2._4_4_ = p2._4_4_ % 10000000;
      break;
    case 9:
      tmp._0_4_ = p2._4_4_ / 100000000;
      p2._4_4_ = p2._4_4_ % 100000000;
    }
    if (((uint)tmp != 0) || (*len != 0)) {
      iVar1 = *len;
      *len = iVar1 + 1;
      buffer[iVar1] = (char)(uint)tmp + '0';
    }
    tmp._4_4_ = tmp._4_4_ + -1;
  } while (delta < _d + ((ulong)p2._4_4_ << (-(char)one.f & 0x3fU)));
  *K = tmp._4_4_ + *K;
  GrisuRound(buffer,*len,delta,(uint64_t)(_d + ((ulong)p2._4_4_ << (-(char)one.f & 0x3fU))),
             (ulong)DigitGen::kPow10[tmp._4_4_] << (-(char)one.f & 0x3fU),DVar3.f);
  return;
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
    static const uint32_t kPow10[] = { 1, 10, 100, 1000, 10000, 100000, 1000000, 10000000, 100000000, 1000000000 };
    const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
    const DiyFp wp_w = Mp - W;
    uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
    uint64_t p2 = Mp.f & (one.f - 1);
    int kappa = CountDecimalDigit32(p1); // kappa in [0, 9]
    *len = 0;

    while (kappa > 0) {
        uint32_t d = 0;
        switch (kappa) {
            case  9: d = p1 /  100000000; p1 %=  100000000; break;
            case  8: d = p1 /   10000000; p1 %=   10000000; break;
            case  7: d = p1 /    1000000; p1 %=    1000000; break;
            case  6: d = p1 /     100000; p1 %=     100000; break;
            case  5: d = p1 /      10000; p1 %=      10000; break;
            case  4: d = p1 /       1000; p1 %=       1000; break;
            case  3: d = p1 /        100; p1 %=        100; break;
            case  2: d = p1 /         10; p1 %=         10; break;
            case  1: d = p1;              p1 =           0; break;
            default:;
        }
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + static_cast<char>(d));
        kappa--;
        uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
        if (tmp <= delta) {
            *K += kappa;
            GrisuRound(buffer, *len, delta, tmp, static_cast<uint64_t>(kPow10[kappa]) << -one.e, wp_w.f);
            return;
        }
    }

    // kappa = 0
    for (;;) {
        p2 *= 10;
        delta *= 10;
        char d = static_cast<char>(p2 >> -one.e);
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + d);
        p2 &= one.f - 1;
        kappa--;
        if (p2 < delta) {
            *K += kappa;
            int index = -kappa;
            GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * (index < 9 ? kPow10[index] : 0));
            return;
        }
    }
}